

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O2

MPP_RET enc_impl_gen_hdr(EncImpl impl,MppPacket pkt)

{
  MPP_RET MVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  if (impl == (EncImpl)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_gen_hdr");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)impl + 0x18) + 0x30);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      if (pkt != (MppPacket)0x0) {
        mpp_packet_reset_segment(pkt);
        UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)impl + 0x18) + 0x30);
      }
      MVar1 = (*UNRECOVERED_JUMPTABLE)(*(undefined8 *)((long)impl + 0x20),pkt);
      return MVar1;
    }
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET enc_impl_gen_hdr(EncImpl impl, MppPacket pkt)
{
    if (NULL == impl) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_OK;
    EncImplCtx *p = (EncImplCtx *)impl;

    if (p->api->gen_hdr) {
        if (pkt)
            mpp_packet_reset_segment(pkt);

        ret = p->api->gen_hdr(p->ctx, pkt);
    }

    return ret;
}